

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS ref_migrate_to_balance(REF_GRID ref_grid)

{
  int *piVar1;
  int iVar2;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_MPI ref_mpi_00;
  uint uVar3;
  uint uVar4;
  REF_INT *node_part;
  ulong uVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  ulong uVar13;
  REF_INT max_age;
  uint local_54;
  REF_MPI local_50;
  REF_NODE local_48;
  void *local_40;
  REF_INT age;
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar3 = ref_node_synchronize_globals(ref_node);
  if (uVar3 != 0) {
    pcVar12 = "sync global nodes";
    uVar9 = 0x6cd;
    goto LAB_001ff766;
  }
  uVar3 = ref_node_collect_ghost_age(ref_node);
  if (uVar3 != 0) {
    pcVar12 = "collect ghost age";
    uVar9 = 0x6ce;
    goto LAB_001ff766;
  }
  if (ref_grid->partitioner_full == 0) {
    max_age = 0;
    age = 0;
    for (lVar6 = 0; lVar6 < ref_node->max; lVar6 = lVar6 + 1) {
      if ((-1 < ref_node->global[lVar6]) &&
         (iVar11 = ref_node->age[lVar6], max_age = age, age <= iVar11)) {
        age = iVar11;
        max_age = iVar11;
      }
    }
    uVar3 = ref_mpi_max(ref_mpi,&age,&max_age,1);
    if (uVar3 != 0) {
      pcVar12 = "mpi max";
      uVar9 = 0x6d8;
      goto LAB_001ff766;
    }
    uVar3 = ref_mpi_bcast(ref_mpi,&max_age,1,1);
    if (uVar3 != 0) {
      pcVar12 = "min";
      uVar9 = 0x6d9;
      goto LAB_001ff766;
    }
    uVar13 = 1000;
    if (1000 < max_age * 10) {
      uVar13 = (ulong)(uint)(max_age * 10);
    }
    uVar4 = (uint)(ref_node->old_n_global / (long)uVar13);
    uVar3 = 1;
    if (1 < (int)uVar4) {
      uVar3 = uVar4;
    }
    if (ref_mpi->n < (int)uVar3) {
      uVar3 = ref_mpi->n;
    }
  }
  else {
    uVar3 = ref_mpi->n;
  }
  uVar13 = (ulong)ref_node->max;
  if ((long)uVar13 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6e0
           ,"ref_migrate_to_balance","malloc node_part of REF_INT negative");
    return 1;
  }
  node_part = (REF_INT *)malloc(uVar13 * 4);
  if (node_part == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6e0
           ,"ref_migrate_to_balance","malloc node_part of REF_INT NULL");
    return 2;
  }
  for (uVar5 = 0; uVar5 < uVar13; uVar5 = uVar5 + 1) {
    node_part[uVar5] = -1;
  }
  if (((int)uVar3 < 2) || (ref_grid->mpi->n < 2)) {
    ref_migrate_single_part(ref_grid,node_part);
LAB_001ff95b:
    uVar3 = ref_node_ghost_int(ref_node,node_part,1);
    if (uVar3 == 0) {
      if (1 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"migrate: new part");
      }
      if (ref_grid->interp == (REF_INTERP)0x0) {
        for (lVar6 = 0; lVar6 < ref_node->max; lVar6 = lVar6 + 1) {
          ref_node->part[lVar6] = node_part[lVar6];
        }
        uVar3 = ref_migrate_shufflin(ref_grid);
        if (uVar3 == 0) {
          pcVar12 = "shuffle primal";
          goto LAB_001ffc85;
        }
        pcVar12 = "shufflin";
        uVar9 = 0x6ef;
      }
      else {
        uVar3 = ref_interp_from_part(ref_grid->interp,node_part);
        if (uVar3 == 0) {
          pcVar12 = "shuffle primal back";
LAB_001ffc85:
          ref_mpi_stopwatch_stop(ref_grid->mpi,pcVar12);
          free(node_part);
          return 0;
        }
        pcVar12 = "from part";
        uVar9 = 0x6e9;
      }
    }
    else {
      pcVar12 = "ghost part";
      uVar9 = 0x6e3;
    }
  }
  else {
    switch(ref_grid->partitioner) {
    case REF_MIGRATE_RECOMMENDED:
    case REF_MIGRATE_PARMETIS:
    case REF_MIGRATE_ZOLTAN_GRAPH:
    case REF_MIGRATE_ZOLTAN_RCB:
      local_54 = uVar3;
      uVar3 = ref_migrate_native_rcb_part(ref_grid,uVar3,node_part);
      if (uVar3 == 0) goto LAB_001ffaf6;
      pcVar12 = "single by method";
      uVar9 = 0x551;
      break;
    case REF_MIGRATE_SINGLE:
      local_54 = uVar3;
      ref_migrate_single_part(ref_grid,node_part);
LAB_001ffaf6:
      ref_mpi_00 = ref_grid->mpi;
      uVar3 = ref_mpi_00->n;
      lVar6 = (long)(int)uVar3;
      if (lVar6 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x112,"ref_migrate_report_load_balance","malloc partition_size of REF_INT negative");
LAB_001ffba7:
        uVar3 = 1;
      }
      else {
        local_48 = ref_grid->node;
        pvVar7 = malloc(lVar6 * 4);
        if (pvVar7 == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x112,"ref_migrate_report_load_balance","malloc partition_size of REF_INT NULL");
          uVar3 = 2;
        }
        else {
          for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
            *(undefined4 *)((long)pvVar7 + lVar8 * 4) = 0;
          }
          uVar5 = 0;
          uVar13 = (ulong)(uint)local_48->max;
          if (local_48->max < 1) {
            uVar13 = uVar5;
          }
          for (; local_50 = ref_mpi_00, uVar13 != uVar5; uVar5 = uVar5 + 1) {
            if ((-1 < local_48->global[uVar5]) && (local_48->ref_mpi->id == local_48->part[uVar5]))
            {
              if (uVar3 <= (uint)node_part[uVar5]) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x11a,"ref_migrate_report_load_balance","part out of range");
                printf("rank %d node %d node_part %d n %d",(ulong)(uint)local_50->id,
                       uVar5 & 0xffffffff,(ulong)(uint)node_part[uVar5],(ulong)(uint)local_50->n);
                goto LAB_001ffba7;
              }
              piVar1 = (int *)((long)pvVar7 + (ulong)(uint)node_part[uVar5] * 4);
              *piVar1 = *piVar1 + 1;
            }
          }
          local_40 = pvVar7;
          uVar3 = ref_mpi_allsum(ref_mpi_00,pvVar7,uVar3,1);
          pvVar7 = local_40;
          if (uVar3 == 0) {
            iVar10 = 0x7fffffff;
            iVar11 = 0;
            for (uVar13 = 0; local_54 != uVar13; uVar13 = uVar13 + 1) {
              iVar2 = *(int *)((long)local_40 + uVar13 * 4);
              if (iVar2 <= iVar10) {
                iVar10 = iVar2;
              }
              if (iVar11 <= iVar2) {
                iVar11 = iVar2;
              }
            }
            if (ref_mpi_00->id == 0) {
              printf("balance %6.3f on %d of %d target %d size min %d max %d\n",
                     (double)(int)local_54 * ((double)iVar11 / (double)local_48->old_n_global),
                     (ulong)local_54,(ulong)(uint)ref_mpi_00->n,
                     local_48->old_n_global / (long)(ulong)local_54 & 0xffffffff);
            }
            free(pvVar7);
            goto LAB_001ff95b;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x11f,"ref_migrate_report_load_balance",(ulong)uVar3,"allsum");
        }
      }
      pcVar12 = "report bal";
      uVar9 = 0x55f;
      break;
    case REF_MIGRATE_NATIVE_RCB:
      local_54 = uVar3;
      uVar3 = ref_migrate_native_rcb_part(ref_grid,uVar3,node_part);
      if (uVar3 == 0) goto LAB_001ffaf6;
      pcVar12 = "single by method";
      uVar9 = 0x537;
      break;
    default:
      if (ref_grid->mpi->id == 0) {
        printf("requested partitioner method %d is not recognized or configured\n");
      }
      pcVar12 = "ref_migrate_method";
      uVar3 = 6;
      uVar9 = 0x55b;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar9
           ,"ref_migrate_new_part",(ulong)uVar3,pcVar12);
    pcVar12 = "new part";
    uVar9 = 0x6e2;
  }
LAB_001ff766:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar9,
         "ref_migrate_to_balance",(ulong)uVar3,pcVar12);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_to_balance(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT npart;
  REF_INT node, age, max_age;
  REF_INT node_per_core, heuristic;
  REF_INT *node_part;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");
  RSS(ref_node_collect_ghost_age(ref_node), "collect ghost age");
  if (ref_grid_partitioner_full(ref_grid)) {
    npart = ref_mpi_n(ref_mpi);
  } else {
    /* heuristic to reduce the number of active cores when over decomposed */
    max_age = 0;
    each_ref_node_valid_node(ref_node, node) {
      max_age = MAX(max_age, ref_node_age(ref_node, node));
    }
    age = max_age;
    RSS(ref_mpi_max(ref_mpi, &age, &max_age, REF_INT_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_age, 1, REF_INT_TYPE), "min");
    node_per_core = MAX(1000, 10 * max_age);
    heuristic = MAX(
        1, (REF_INT)(ref_node_n_global(ref_node) / (REF_GLOB)node_per_core));
    npart = MIN(ref_mpi_n(ref_mpi), heuristic);
  }

  ref_malloc_init(node_part, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  RSS(ref_migrate_new_part(ref_grid, npart, node_part), "new part");
  RSS(ref_node_ghost_int(ref_node, node_part, 1), "ghost part");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "migrate: new part");

  if (NULL != ref_grid_interp(ref_grid)) {
    RSS(ref_interp_from_part(ref_grid_interp(ref_grid), node_part),
        "from part");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "shuffle primal back");
  } else {
    for (node = 0; node < ref_node_max(ref_node); node++)
      ref_node_part(ref_node, node) = node_part[node];

    RSS(ref_migrate_shufflin(ref_grid), "shufflin");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "shuffle primal");
  }
  ref_free(node_part);

  return REF_SUCCESS;
}